

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::updateMaxCase
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_t sVar9;
  size_type *psVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  CppGenerator *this_00;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  string __str_4;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string __str_5;
  ulong *local_898;
  uint local_890;
  undefined4 uStack_88c;
  ulong local_888 [2];
  ulong *local_878;
  uint local_870;
  undefined4 uStack_86c;
  ulong local_868 [2];
  ulong *local_858;
  uint local_850;
  undefined4 uStack_84c;
  ulong local_848 [2];
  ulong *local_838;
  uint local_830;
  undefined4 uStack_82c;
  ulong local_828 [2];
  ulong *local_818;
  uint local_810;
  undefined4 uStack_80c;
  ulong local_808 [2];
  ulong *local_7f8;
  uint local_7f0;
  undefined4 uStack_7ec;
  ulong local_7e8 [2];
  string *local_7d8;
  ulong *local_7d0;
  long local_7c8;
  ulong local_7c0;
  long lStack_7b8;
  ulong *local_7b0;
  long local_7a8;
  ulong local_7a0;
  long lStack_798;
  ulong *local_790;
  long local_788;
  ulong local_780;
  long lStack_778;
  ulong *local_770;
  long local_768;
  ulong local_760;
  long lStack_758;
  ulong *local_750;
  long local_748;
  ulong local_740;
  undefined4 uStack_738;
  undefined4 uStack_734;
  ulong *local_730;
  long local_728;
  ulong local_720;
  long lStack_718;
  ulong *local_710;
  long local_708;
  ulong local_700;
  long lStack_6f8;
  ulong *local_6f0;
  long local_6e8;
  ulong local_6e0;
  long lStack_6d8;
  ulong *local_6d0;
  long local_6c8;
  ulong local_6c0;
  long lStack_6b8;
  ulong *local_6b0;
  long local_6a8;
  ulong local_6a0;
  long lStack_698;
  ulong *local_690;
  long local_688;
  ulong local_680;
  long lStack_678;
  ulong *local_670;
  long local_668;
  ulong local_660;
  long lStack_658;
  ulong *local_650;
  long local_648;
  ulong local_640;
  long lStack_638;
  ulong *local_630;
  long local_628;
  ulong local_620;
  long lStack_618;
  ulong *local_610;
  uint local_608;
  undefined4 uStack_604;
  ulong local_600 [2];
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0 [2];
  ulong *local_5d0;
  long local_5c8;
  ulong local_5c0 [2];
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0 [2];
  ulong *local_590;
  long local_588;
  ulong local_580 [2];
  ulong *local_570;
  long local_568;
  ulong local_560 [2];
  ulong *local_550;
  long local_548;
  ulong local_540 [2];
  ulong *local_530;
  long local_528;
  ulong local_520 [2];
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  string local_250;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar13 = (char)depth;
  local_50[0] = local_40;
  local_7d8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_50,cVar13 * '\x03' + '\t');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  local_230 = &local_220;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_220 = *plVar7;
    lStack_218 = plVar5[3];
  }
  else {
    local_220 = *plVar7;
    local_230 = (long *)*plVar5;
  }
  local_228 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)(rel_name->_M_dataplus)._M_p);
  local_210 = &local_200;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_200 = *plVar7;
    lStack_1f8 = plVar5[3];
  }
  else {
    local_200 = *plVar7;
    local_210 = (long *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7c0 = *puVar8;
    lStack_7b8 = plVar5[3];
    local_7d0 = &local_7c0;
  }
  else {
    local_7c0 = *puVar8;
    local_7d0 = (ulong *)*plVar5;
  }
  local_7c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = cVar13 * '\x03' + '\f';
  local_530 = local_520;
  std::__cxx11::string::_M_construct((ulong)&local_530,cVar11);
  uVar16 = 0xf;
  if (local_7d0 != &local_7c0) {
    uVar16 = local_7c0;
  }
  if (uVar16 < (ulong)(local_528 + local_7c8)) {
    uVar16 = 0xf;
    if (local_530 != local_520) {
      uVar16 = local_520[0];
    }
    if (uVar16 < (ulong)(local_528 + local_7c8)) goto LAB_002841c9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,(ulong)local_7d0);
  }
  else {
LAB_002841c9:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_530);
  }
  local_510 = &local_500;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_500 = *puVar1;
    uStack_4f8 = puVar6[3];
  }
  else {
    local_500 = *puVar1;
    local_510 = (undefined8 *)*puVar6;
  }
  local_508 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_510);
  local_1f0 = &local_1e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1e0 = *plVar7;
    lStack_1d8 = plVar5[3];
  }
  else {
    local_1e0 = *plVar7;
    local_1f0 = (long *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_1d0 = &local_1c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1c0 = *plVar7;
    lStack_1b8 = plVar5[3];
  }
  else {
    local_1c0 = *plVar7;
    local_1d0 = (long *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7a0 = *puVar8;
    lStack_798 = plVar5[3];
    local_7b0 = &local_7a0;
  }
  else {
    local_7a0 = *puVar8;
    local_7b0 = (ulong *)*plVar5;
  }
  local_7a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_002843c6;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_002843c6;
      }
      if (sVar9 < 10000) goto LAB_002843c6;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_002843c6:
  local_7f8 = local_7e8;
  std::__cxx11::string::_M_construct((ulong)&local_7f8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_7f8,local_7f0,depth);
  uVar16 = CONCAT44(uStack_7ec,local_7f0) + local_7a8;
  uVar15 = 0xf;
  if (local_7b0 != &local_7a0) {
    uVar15 = local_7a0;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_7f8 != local_7e8) {
      uVar15 = local_7e8[0];
    }
    if (uVar15 < uVar16) goto LAB_00284449;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7f8,0,(char *)0x0,(ulong)local_7b0);
  }
  else {
LAB_00284449:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b0,(ulong)local_7f8);
  }
  local_4f0 = &local_4e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4e0 = *puVar1;
    uStack_4d8 = puVar6[3];
  }
  else {
    local_4e0 = *puVar1;
    local_4f0 = (undefined8 *)*puVar6;
  }
  local_4e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_780 = *puVar8;
    lStack_778 = plVar5[3];
    local_790 = &local_780;
  }
  else {
    local_780 = *puVar8;
    local_790 = (ulong *)*plVar5;
  }
  local_788 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_550 = local_540;
  std::__cxx11::string::_M_construct((ulong)&local_550,cVar11);
  uVar16 = 0xf;
  if (local_790 != &local_780) {
    uVar16 = local_780;
  }
  if (uVar16 < (ulong)(local_548 + local_788)) {
    uVar16 = 0xf;
    if (local_550 != local_540) {
      uVar16 = local_540[0];
    }
    if (uVar16 < (ulong)(local_548 + local_788)) goto LAB_0028459b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_550,0,(char *)0x0,(ulong)local_790);
  }
  else {
LAB_0028459b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_790,(ulong)local_550);
  }
  local_4d0 = &local_4c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4c0 = *puVar1;
    uStack_4b8 = puVar6[3];
  }
  else {
    local_4c0 = *puVar1;
    local_4d0 = (undefined8 *)*puVar6;
  }
  local_4c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  local_1b0 = &local_1a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1a0 = *plVar7;
    lStack_198 = plVar5[3];
  }
  else {
    local_1a0 = *plVar7;
    local_1b0 = (long *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_190 = &local_180;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_180 = *plVar7;
    lStack_178 = plVar5[3];
  }
  else {
    local_180 = *plVar7;
    local_190 = (long *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_760 = *puVar8;
    lStack_758 = plVar5[3];
    local_770 = &local_760;
  }
  else {
    local_760 = *puVar8;
    local_770 = (ulong *)*plVar5;
  }
  local_768 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00284798;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00284798;
      }
      if (sVar9 < 10000) goto LAB_00284798;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00284798:
  local_818 = local_808;
  std::__cxx11::string::_M_construct((ulong)&local_818,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_818,local_810,depth);
  uVar16 = CONCAT44(uStack_80c,local_810) + local_768;
  uVar15 = 0xf;
  if (local_770 != &local_760) {
    uVar15 = local_760;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_818 != local_808) {
      uVar15 = local_808[0];
    }
    if (uVar15 < uVar16) goto LAB_0028481b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_818,0,(char *)0x0,(ulong)local_770);
  }
  else {
LAB_0028481b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_770,(ulong)local_818);
  }
  local_4b0 = &local_4a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4a0 = *puVar1;
    uStack_498 = puVar6[3];
  }
  else {
    local_4a0 = *puVar1;
    local_4b0 = (undefined8 *)*puVar6;
  }
  local_4a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_740 = *puVar8;
    uStack_738 = (undefined4)plVar5[3];
    uStack_734 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_750 = &local_740;
  }
  else {
    local_740 = *puVar8;
    local_750 = (ulong *)*plVar5;
  }
  local_748 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  this_00 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this_00,
             (pointer)((long)&(this_00->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_250,this_00,&local_70,depth,parallel);
  uVar16 = 0xf;
  if (local_750 != &local_740) {
    uVar16 = local_740;
  }
  if (uVar16 < local_250._M_string_length + local_748) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_250._M_string_length + local_748) goto LAB_0028498e;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_750);
  }
  else {
LAB_0028498e:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_750,(ulong)local_250._M_dataplus._M_p);
  }
  local_490 = &local_480;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_480 = *puVar1;
    uStack_478 = puVar6[3];
  }
  else {
    local_480 = *puVar1;
    local_490 = (undefined8 *)*puVar6;
  }
  local_488 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_720 = *puVar8;
    lStack_718 = plVar5[3];
    local_730 = &local_720;
  }
  else {
    local_720 = *puVar8;
    local_730 = (ulong *)*plVar5;
  }
  local_728 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = cVar13 * '\x03' + '\x0f';
  local_570 = local_560;
  std::__cxx11::string::_M_construct((ulong)&local_570,cVar13);
  uVar16 = 0xf;
  if (local_730 != &local_720) {
    uVar16 = local_720;
  }
  if (uVar16 < (ulong)(local_568 + local_728)) {
    uVar16 = 0xf;
    if (local_570 != local_560) {
      uVar16 = local_560[0];
    }
    if (uVar16 < (ulong)(local_568 + local_728)) goto LAB_00284ae3;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_570,0,(char *)0x0,(ulong)local_730);
  }
  else {
LAB_00284ae3:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_730,(ulong)local_570);
  }
  local_470 = &local_460;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_460 = *puVar1;
    uStack_458 = puVar6[3];
  }
  else {
    local_460 = *puVar1;
    local_470 = (undefined8 *)*puVar6;
  }
  local_468 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_470);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_700 = *puVar8;
    lStack_6f8 = plVar5[3];
    local_710 = &local_700;
  }
  else {
    local_700 = *puVar8;
    local_710 = (ulong *)*plVar5;
  }
  local_708 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00284c1d;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00284c1d;
      }
      if (sVar9 < 10000) goto LAB_00284c1d;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00284c1d:
  local_838 = local_828;
  std::__cxx11::string::_M_construct((ulong)&local_838,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_838,local_830,depth);
  uVar16 = CONCAT44(uStack_82c,local_830) + local_708;
  uVar15 = 0xf;
  if (local_710 != &local_700) {
    uVar15 = local_700;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_838 != local_828) {
      uVar15 = local_828[0];
    }
    if (uVar15 < uVar16) goto LAB_00284c91;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_838,0,(char *)0x0,(ulong)local_710);
  }
  else {
LAB_00284c91:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_710,(ulong)local_838);
  }
  local_450 = &local_440;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_440 = *puVar1;
    uStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar1;
    local_450 = (undefined8 *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_6e0 = *puVar8;
    lStack_6d8 = plVar5[3];
    local_6f0 = &local_6e0;
  }
  else {
    local_6e0 = *puVar8;
    local_6f0 = (ulong *)*plVar5;
  }
  local_6e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_590 = local_580;
  std::__cxx11::string::_M_construct((ulong)&local_590,cVar11);
  uVar16 = 0xf;
  if (local_6f0 != &local_6e0) {
    uVar16 = local_6e0;
  }
  if (uVar16 < (ulong)(local_588 + local_6e8)) {
    uVar16 = 0xf;
    if (local_590 != local_580) {
      uVar16 = local_580[0];
    }
    if (uVar16 < (ulong)(local_588 + local_6e8)) goto LAB_00284ddd;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_590,0,(char *)0x0,(ulong)local_6f0);
  }
  else {
LAB_00284ddd:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f0,(ulong)local_590);
  }
  local_430 = &local_420;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_420 = *puVar1;
    uStack_418 = puVar6[3];
  }
  else {
    local_420 = *puVar1;
    local_430 = (undefined8 *)*puVar6;
  }
  local_428 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_6c0 = *puVar8;
    lStack_6b8 = plVar5[3];
    local_6d0 = &local_6c0;
  }
  else {
    local_6c0 = *puVar8;
    local_6d0 = (ulong *)*plVar5;
  }
  local_6c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_5b0 = local_5a0;
  std::__cxx11::string::_M_construct((ulong)&local_5b0,cVar11);
  uVar16 = 0xf;
  if (local_6d0 != &local_6c0) {
    uVar16 = local_6c0;
  }
  if (uVar16 < (ulong)(local_5a8 + local_6c8)) {
    uVar16 = 0xf;
    if (local_5b0 != local_5a0) {
      uVar16 = local_5a0[0];
    }
    if (uVar16 < (ulong)(local_5a8 + local_6c8)) goto LAB_00284f2f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,(ulong)local_6d0);
  }
  else {
LAB_00284f2f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d0,(ulong)local_5b0);
  }
  local_410 = &local_400;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_400 = *puVar1;
    uStack_3f8 = puVar6[3];
  }
  else {
    local_400 = *puVar1;
    local_410 = (undefined8 *)*puVar6;
  }
  local_408 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_410);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_6a0 = *puVar8;
    lStack_698 = plVar5[3];
    local_6b0 = &local_6a0;
  }
  else {
    local_6a0 = *puVar8;
    local_6b0 = (ulong *)*plVar5;
  }
  local_6a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_5d0 = local_5c0;
  std::__cxx11::string::_M_construct((ulong)&local_5d0,cVar13);
  uVar16 = 0xf;
  if (local_6b0 != &local_6a0) {
    uVar16 = local_6a0;
  }
  if (uVar16 < (ulong)(local_5c8 + local_6a8)) {
    uVar16 = 0xf;
    if (local_5d0 != local_5c0) {
      uVar16 = local_5c0[0];
    }
    if (uVar16 < (ulong)(local_5c8 + local_6a8)) goto LAB_0028507f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5d0,0,(char *)0x0,(ulong)local_6b0);
  }
  else {
LAB_0028507f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6b0,(ulong)local_5d0);
  }
  local_3f0 = &local_3e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_3e0 = *puVar1;
    uStack_3d8 = puVar6[3];
  }
  else {
    local_3e0 = *puVar1;
    local_3f0 = (undefined8 *)*puVar6;
  }
  local_3e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_170 = &local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170 = (long *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(attr_name->_M_dataplus)._M_p);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_130 = &local_120;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(rel_name->_M_dataplus)._M_p);
  local_110 = &local_100;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_e0 = *plVar7;
    lStack_d8 = plVar5[3];
  }
  else {
    local_e0 = *plVar7;
    local_f0 = (long *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_d0 = &local_c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_c0 = *plVar7;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_680 = *puVar8;
    lStack_678 = plVar5[3];
    local_690 = &local_680;
  }
  else {
    local_680 = *puVar8;
    local_690 = (ulong *)*plVar5;
  }
  local_688 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00285403;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00285403;
      }
      if (sVar9 < 10000) goto LAB_00285403;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00285403:
  local_858 = local_848;
  std::__cxx11::string::_M_construct((ulong)&local_858,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_858,local_850,depth);
  uVar16 = CONCAT44(uStack_84c,local_850) + local_688;
  uVar15 = 0xf;
  if (local_690 != &local_680) {
    uVar15 = local_680;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_858 != local_848) {
      uVar15 = local_848[0];
    }
    if (uVar15 < uVar16) goto LAB_00285471;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_858,0,(char *)0x0,(ulong)local_690);
  }
  else {
LAB_00285471:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_690,(ulong)local_858);
  }
  local_3d0 = &local_3c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_3c0 = *puVar1;
    uStack_3b8 = puVar6[3];
  }
  else {
    local_3c0 = *puVar1;
    local_3d0 = (undefined8 *)*puVar6;
  }
  local_3c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_b0 = &local_a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_90 = &local_80;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = plVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
    local_2f0 = (ulong *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct((ulong)&local_5f0,cVar13);
  uVar16 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar16 = local_2e0;
  }
  if (uVar16 < (ulong)(local_5e8 + local_2e8)) {
    uVar16 = 0xf;
    if (local_5f0 != local_5e0) {
      uVar16 = local_5e0[0];
    }
    if (uVar16 < (ulong)(local_5e8 + local_2e8)) goto LAB_00285682;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5f0,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_00285682:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_5f0);
  }
  local_3b0 = &local_3a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_3a0 = *puVar1;
    uStack_398 = puVar6[3];
  }
  else {
    local_3a0 = *puVar1;
    local_3b0 = (undefined8 *)*puVar6;
  }
  local_3a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_660 = *puVar8;
    lStack_658 = plVar5[3];
    local_670 = &local_660;
  }
  else {
    local_660 = *puVar8;
    local_670 = (ulong *)*plVar5;
  }
  local_668 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_002857bc;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_002857bc;
      }
      if (sVar9 < 10000) goto LAB_002857bc;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_002857bc:
  local_878 = local_868;
  std::__cxx11::string::_M_construct((ulong)&local_878,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_878,local_870,depth);
  uVar16 = CONCAT44(uStack_86c,local_870) + local_668;
  uVar15 = 0xf;
  if (local_670 != &local_660) {
    uVar15 = local_660;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_878 != local_868) {
      uVar15 = local_868[0];
    }
    if (uVar15 < uVar16) goto LAB_0028582a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_878,0,(char *)0x0,(ulong)local_670);
  }
  else {
LAB_0028582a:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_670,(ulong)local_878);
  }
  local_390 = &local_380;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_380 = *puVar1;
    uStack_378 = puVar6[3];
  }
  else {
    local_380 = *puVar1;
    local_390 = (undefined8 *)*puVar6;
  }
  local_388 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_390);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_640 = *puVar8;
    lStack_638 = plVar5[3];
    local_650 = &local_640;
  }
  else {
    local_640 = *puVar8;
    local_650 = (ulong *)*plVar5;
  }
  local_648 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0028595e;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0028595e;
      }
      if (sVar9 < 10000) goto LAB_0028595e;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_0028595e:
  local_898 = local_888;
  std::__cxx11::string::_M_construct((ulong)&local_898,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_898,local_890,depth);
  uVar16 = CONCAT44(uStack_88c,local_890) + local_648;
  uVar15 = 0xf;
  if (local_650 != &local_640) {
    uVar15 = local_640;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_898 != local_888) {
      uVar15 = local_888[0];
    }
    if (uVar15 < uVar16) goto LAB_002859cc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_898,0,(char *)0x0,(ulong)local_650);
  }
  else {
LAB_002859cc:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_650,(ulong)local_898);
  }
  local_370 = &local_360;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_360 = *puVar1;
    uStack_358 = puVar6[3];
  }
  else {
    local_360 = *puVar1;
    local_370 = (undefined8 *)*puVar6;
  }
  local_368 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_370);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_620 = *puVar8;
    lStack_618 = plVar5[3];
    local_630 = &local_620;
  }
  else {
    local_620 = *puVar8;
    local_630 = (ulong *)*plVar5;
  }
  local_628 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00285b00;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00285b00;
      }
      if (sVar9 < 10000) goto LAB_00285b00;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_00285b00:
  local_610 = local_600;
  std::__cxx11::string::_M_construct((ulong)&local_610,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_610,local_608,depth);
  uVar16 = CONCAT44(uStack_604,local_608) + local_628;
  uVar15 = 0xf;
  if (local_630 != &local_620) {
    uVar15 = local_620;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_610 != local_600) {
      uVar15 = local_600[0];
    }
    if (uVar15 < uVar16) goto LAB_00285b83;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_610,0,(char *)0x0,(ulong)local_630);
  }
  else {
LAB_00285b83:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_630,(ulong)local_610);
  }
  local_350 = &local_340;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_340 = *puVar1;
    uStack_338 = puVar6[3];
  }
  else {
    local_340 = *puVar1;
    local_350 = (undefined8 *)*puVar6;
  }
  local_348 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = plVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
    local_2d0 = (ulong *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,cVar11);
  uVar16 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar16 = local_2c0;
  }
  if (uVar16 < (ulong)(local_268 + local_2c8)) {
    uVar16 = 0xf;
    if (local_270 != local_260) {
      uVar16 = local_260[0];
    }
    if (uVar16 < (ulong)(local_268 + local_2c8)) goto LAB_00285cd5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_00285cd5:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270);
  }
  local_330 = &local_320;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_320 = *puVar1;
    uStack_318 = puVar6[3];
  }
  else {
    local_320 = *puVar1;
    local_330 = (undefined8 *)*puVar6;
  }
  local_328 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2a0 = *puVar8;
    lStack_298 = plVar5[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar8;
    local_2b0 = (ulong *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar11);
  uVar16 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar16 = local_2a0;
  }
  if (uVar16 < (ulong)(local_288 + local_2a8)) {
    uVar16 = 0xf;
    if (local_290 != local_280) {
      uVar16 = local_280[0];
    }
    if ((ulong)(local_288 + local_2a8) <= uVar16) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
      goto LAB_00285e55;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290);
LAB_00285e55:
  local_310 = &local_300;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_300 = *puVar1;
    uStack_2f8 = puVar6[3];
  }
  else {
    local_300 = *puVar1;
    local_310 = (undefined8 *)*puVar6;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  (local_7d8->_M_dataplus)._M_p = (pointer)&local_7d8->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (local_7d8->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_7d8->field_2 + 8) = lVar3;
  }
  else {
    (local_7d8->_M_dataplus)._M_p = (pointer)*plVar5;
    (local_7d8->field_2)._M_allocated_capacity = *psVar10;
  }
  local_7d8->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  if (local_630 != &local_620) {
    operator_delete(local_630);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_898 != local_888) {
    operator_delete(local_898);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_878 != local_868) {
    operator_delete(local_878);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_858 != local_848) {
    operator_delete(local_858);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  if (local_6b0 != &local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_838 != local_828) {
    operator_delete(local_838);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470);
  }
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0);
  }
  if (local_818 != local_808) {
    operator_delete(local_818);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0);
  }
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0);
  }
  if (local_7f8 != local_7e8) {
    operator_delete(local_7f8);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510);
  }
  if (local_530 != local_520) {
    operator_delete(local_530);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return local_7d8;
}

Assistant:

std::string CppGenerator::updateMaxCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(3+depth)+"case "+rel_name+"_ID:\n"+
        // update pointer
        offset(4+depth)+"lowerptr_"+rel_name+"["+
        std::to_string(depth)+"] += 1;\n"+
        // if statement
        offset(4+depth)+"if(lowerptr_"+rel_name+"["+
        std::to_string(depth)+"] > "+getUpperPointer(rel_name,depth,parallel)+")\n"+
        // body
        offset(5+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else
        offset(4+depth)+"else\n"+offset(4+depth)+"{\n"+
        offset(5+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(5+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+ 1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(4+depth)+"}\n"+offset(4+depth)+"break;\n";
}